

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,1,3,1,1,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_1,_3,_1,_1,_3> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
               *src,assign_op<double,_double> *func)

{
  undefined8 func_00;
  Matrix<double,_1,_3,_1,_1,_3> *dstExpr;
  undefined1 local_b8 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_78 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  *src_local;
  Matrix<double,_1,_3,_1,_1,_3> *dst_local;
  
  srcEvaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_rhsImpl.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_rhsImpl.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>._8_8_ = func;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
  ::evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
               *)local_78,src);
  resize_if_allowed<Eigen::Matrix<double,1,3,1,1,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>const>const>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_rhsImpl.
                     super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                     .
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_rhsImpl.
                     super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     .
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_rhsImpl.super_evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._8_8_);
  evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_rhsImpl.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_rhsImpl.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_rhsImpl.super_evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>._8_8_;
  dstExpr = EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_b8,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_78,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_b8);
  evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
  ::~evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
                *)local_78);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}